

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QRect __thiscall QAccessibleLineEdit::characterRect(QAccessibleLineEdit *this,int offset)

{
  long lVar1;
  qreal qVar2;
  int iVar3;
  int iVar4;
  QLineEdit *pQVar5;
  QWidget *this_00;
  QPoint QVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QMargins QVar11;
  QRect QVar12;
  QPoint local_60;
  QArrayDataPointer<char16_t> local_58;
  QFontMetrics fm;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0xffffffff00000000;
  pQVar5 = lineEdit(this);
  qVar2 = QWidgetLineControl::cursorToX
                    (*(QWidgetLineControl **)(*(long *)&(pQVar5->super_QWidget).field_0x8 + 600),
                     offset);
  pQVar5 = lineEdit(this);
  QVar11 = QLineEdit::textMargins(pQVar5);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = lineEdit(this);
  QFontMetrics::QFontMetrics(&fm,&((pQVar5->super_QWidget).data)->fnt);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xf8))(&local_58,this,offset,offset + 1);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    uVar10 = 0xffffffff;
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    iVar3 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_58);
    iVar4 = QFontMetrics::height();
    this_00 = &lineEdit(this)->super_QWidget;
    local_60 = (QPoint)((ulong)(uint)(int)qVar2 | QVar11._0_8_ & 0xffffffff00000000);
    QVar6 = QWidget::mapToGlobal(this_00,&local_60);
    uVar10 = (ulong)((QVar6.xp.m_i.m_i + iVar3) - 1);
    uVar9 = (ulong)QVar6 & 0xffffffff00000000;
    uVar8 = (ulong)QVar6 & 0xffffffff;
    uVar7 = (ulong)((iVar4 + QVar6.yp.m_i.m_i) - 1) << 0x20;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QFontMetrics::~QFontMetrics(&fm);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar12.x2.m_i = (int)(uVar7 | uVar10);
    QVar12.y2.m_i = (int)((uVar7 | uVar10) >> 0x20);
    QVar12.x1.m_i = (int)(uVar9 | uVar8);
    QVar12.y1.m_i = (int)((uVar9 | uVar8) >> 0x20);
    return QVar12;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleLineEdit::characterRect(int offset) const
{
    int x = lineEdit()->d_func()->control->cursorToX(offset);
    int y = lineEdit()->textMargins().top();
    QFontMetrics fm(lineEdit()->font());
    const QString ch = text(offset, offset + 1);
    if (ch.isEmpty())
        return QRect();
    int w = fm.horizontalAdvance(ch);
    int h = fm.height();
    QRect r(x, y, w, h);
    r.moveTo(lineEdit()->mapToGlobal(r.topLeft()));
    return r;
}